

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O3

string * namingConventions::findClassName(string *__return_storage_ptr__,string *word)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (word->_M_string_length != 0) {
    uVar2 = 0;
    uVar3 = 1;
    do {
      if ((word->_M_dataplus)._M_p[uVar2] == '{') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      bVar1 = uVar3 < word->_M_string_length;
      uVar2 = uVar3;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string namingConventions::findClassName(std::string &word) {
    std::string name;
    for (unsigned int c = 0; c < word.size(); ++c) {
        if (word[c] != '{') {
            name.push_back(word[c]);
        } else {
            return name;
        }
    }
    return name;
}